

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testSpecDowngradeFlexibleShapes(void)

{
  ulong uVar1;
  bool bVar2;
  ModelDescription *pMVar3;
  FeatureDescription *pFVar4;
  FeatureType *pFVar5;
  ArrayFeatureType *pAVar6;
  ArrayFeatureType_ShapeRange *pAVar7;
  SizeRange *pSVar8;
  NeuralNetwork *pNVar9;
  NeuralNetworkLayer *this;
  UnaryFunctionLayerParams *pUVar10;
  Model *pMVar11;
  ostream *poVar12;
  undefined8 *puVar13;
  uint uVar14;
  Model mlmodel;
  Model m1;
  Result res;
  
  CoreML::Specification::Model::Model(&m1);
  m1.specificationversion_ = 3;
  pMVar3 = CoreML::Specification::Model::_internal_mutable_description(&m1);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->input_);
  uVar1 = (pFVar4->super_MessageLite)._internal_metadata_.ptr_;
  puVar13 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar13 = (undefined8 *)*puVar13;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar4->name_,"input",puVar13);
  pFVar5 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar4);
  pAVar6 = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar5);
  pAVar6->datatype_ = 0x10020;
  pAVar7 = CoreML::Specification::ArrayFeatureType::_internal_mutable_shaperange(pAVar6);
  pSVar8 = google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::Add
                     (&pAVar7->sizeranges_);
  pSVar8->lowerbound_ = 10;
  pSVar8->upperbound_ = 10;
  pMVar3 = CoreML::Specification::Model::_internal_mutable_description(&m1);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->output_);
  uVar1 = (pFVar4->super_MessageLite)._internal_metadata_.ptr_;
  puVar13 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar13 = (undefined8 *)*puVar13;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar4->name_,"probs",puVar13);
  pFVar5 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar4);
  pAVar6 = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar5);
  pAVar6->datatype_ = 0x10040;
  pNVar9 = CoreML::Specification::Model::_internal_mutable_neuralnetwork(&m1);
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (&pNVar9->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(this,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this,"probs");
  pUVar10 = CoreML::Specification::NeuralNetworkLayer::_internal_mutable_unary(this);
  pUVar10->type_ = 6;
  CoreML::validate<(MLModelType)500>(&res,&m1);
  bVar2 = CoreML::Result::good(&res);
  if (bVar2) {
    CoreML::Model::Model(&mlmodel,&m1);
    pMVar11 = CoreML::Model::getProto(&mlmodel);
    bVar2 = pMVar11->specificationversion_ != 3;
    if (bVar2) {
      poVar12 = std::operator<<((ostream *)&std::cout,
                                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                               );
      poVar12 = std::operator<<(poVar12,":");
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,0x1050);
      poVar12 = std::operator<<(poVar12,": error: ");
      poVar12 = std::operator<<(poVar12,
                                "mlmodel.getProto().specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS12"
                               );
      poVar12 = std::operator<<(poVar12," was false, expected true.");
      std::endl<char,std::char_traits<char>>(poVar12);
    }
    uVar14 = (uint)bVar2;
    CoreML::Model::~Model(&mlmodel);
  }
  else {
    poVar12 = std::operator<<((ostream *)&std::cout,
                              "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                             );
    poVar12 = std::operator<<(poVar12,":");
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,0x104c);
    poVar12 = std::operator<<(poVar12,": error: ");
    poVar12 = std::operator<<(poVar12,"(res).good()");
    poVar12 = std::operator<<(poVar12," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar12);
    uVar14 = 1;
  }
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m1);
  return uVar14;
}

Assistant:

int testSpecDowngradeFlexibleShapes() {

    Specification::Model m1;
    m1.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS12);

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *array_type = topIn->mutable_type()->mutable_multiarraytype();
    array_type->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_FLOAT32);

    auto *array_shape1_range = array_type->mutable_shaperange()->add_sizeranges();
    array_shape1_range->set_lowerbound(10);
    array_shape1_range->set_upperbound(10);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("probs");
    auto *outvec = out->mutable_type()->mutable_multiarraytype();
    outvec->set_datatype(Specification::ArrayFeatureType_ArrayDataType_DOUBLE);

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *layer = nn->add_layers();
    layer->add_input("input");
    layer->add_output("probs");

    auto *params = layer->mutable_unary();
    params->set_type(Specification::UnaryFunctionLayerParams::ABS);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    Model mlmodel = Model(m1);

    ML_ASSERT(mlmodel.getProto().specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS12);

    return 0;

}